

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O2

void * tommy_hashlin_remove(tommy_hashlin *hashlin,undefined1 *cmp,void *cmp_arg,tommy_hash_t hash)

{
  long lVar1;
  int iVar2;
  tommy_node *list;
  void *pvVar3;
  tommy_node *node;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  list = (tommy_node *)tommy_hashlin_bucket_ref(hashlin,hash);
  node = list;
  do {
    do {
      node = node->next;
      if (node == (tommy_node *)0x0) {
        pvVar3 = (void *)0x0;
        goto LAB_001057ab;
      }
    } while (node->key != hash);
    iVar2 = (*(code *)cmp)(cmp_arg,node->data);
  } while (iVar2 != 0);
  tommy_list_remove_existing((tommy_list *)list,node);
  hashlin->count = hashlin->count - 1;
  hashlin_shrink_step(hashlin);
  pvVar3 = node->data;
LAB_001057ab:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pvVar3;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_hashlin_remove(tommy_hashlin* hashlin, tommy_search_func* cmp, const void* cmp_arg, tommy_hash_t hash)
{
	tommy_hashlin_node** let_ptr = tommy_hashlin_bucket_ref(hashlin, hash);
	tommy_hashlin_node* node = *let_ptr;

	while (node) {
		/* we first check if the hash matches, as in the same bucket we may have multiples hash values */
		if (node->key == hash && cmp(cmp_arg, node->data) == 0) {
			tommy_list_remove_existing(let_ptr, node);

			--hashlin->count;

			hashlin_shrink_step(hashlin);

			return node->data;
		}
		node = node->next;
	}

	return 0;
}